

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cborparser.c
# Opt level: O1

CborError get_string_chunk_size(CborValue *it,size_t *offset,size_t *len)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  uint8_t *puVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  CborError CVar8;
  ulong uVar9;
  ulong uVar10;
  QCborStreamReaderPrivate *self;
  byte bVar11;
  size_t sVar12;
  
  CVar8 = CborErrorNoMoreStringChunks;
  if ((it->flags & 0x14) != 0) {
    puVar4 = (it->source).ptr;
    if (*(long *)(puVar4 + 0x18) == *(long *)(puVar4 + 0x68)) {
      return CborErrorUnexpectedEOF;
    }
    bVar1 = *(byte *)(*(long *)(puVar4 + 0x10) + *(long *)(puVar4 + 0x68));
    if ((bVar1 != 0xff) && (CVar8 = CborErrorIllegalType, (bVar1 & 0xe0) == it->type)) {
      bVar11 = (byte)(bVar1 & 0x1f);
      if (bVar11 < 0x18) {
        *len = (ulong)(bVar1 & 0x1f);
        sVar12 = 1;
      }
      else {
        if (0x1b < bVar11) {
          return CborErrorIllegalNumber;
        }
        uVar10 = (ulong)(uint)(1 << (bVar11 - 0x18 & 0x1f));
        lVar5 = *(long *)(puVar4 + 0x18);
        lVar6 = *(long *)(puVar4 + 0x68);
        sVar12 = uVar10;
        if (uVar10 < (ulong)(lVar5 - lVar6)) {
          lVar7 = *(long *)(puVar4 + 0x10);
          if (bVar11 < 0x1a) {
            if (bVar11 == 0x19) {
              uVar2 = *(ushort *)(lVar7 + 1 + lVar6);
              uVar9 = (ulong)(ushort)(uVar2 << 8 | uVar2 >> 8);
            }
            else {
              uVar9 = (ulong)*(byte *)(lVar7 + 1 + lVar6);
            }
          }
          else if (bVar11 == 0x1a) {
            uVar3 = *(uint *)(lVar7 + 1 + lVar6);
            uVar9 = (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                           uVar3 << 0x18);
          }
          else {
            uVar9 = *(ulong *)(lVar7 + 1 + lVar6);
            uVar9 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                    (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                    (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
                    (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
          }
          sVar12 = uVar10 + 1;
          *len = uVar9;
        }
        if ((ulong)(lVar5 - lVar6) <= uVar10) {
          return CborErrorUnexpectedEOF;
        }
      }
      *offset = sVar12;
      CVar8 = CborNoError;
    }
  }
  return CVar8;
}

Assistant:

static CborError get_string_chunk_size(const CborValue *it, size_t *offset, size_t *len)
{
    uint8_t descriptor;
    size_t bytesNeeded = 1;

    if (cbor_value_is_length_known(it) && (it->flags & CborIteratorFlag_BeforeFirstStringChunk) == 0)
        return CborErrorNoMoreStringChunks;

    /* are we at the end? */
    if (!read_bytes(it, &descriptor, 0, 1))
        return CborErrorUnexpectedEOF;

    if (descriptor == BreakByte)
        return CborErrorNoMoreStringChunks;
    if ((descriptor & MajorTypeMask) != it->type)
        return CborErrorIllegalType;

    /* find the string length */
    descriptor &= SmallValueMask;
    if (descriptor < Value8Bit) {
        *len = descriptor;
    } else if (unlikely(descriptor > Value64Bit)) {
        return CborErrorIllegalNumber;
    } else {
        uint64_t val;
        bytesNeeded = (size_t)(1 << (descriptor - Value8Bit));
        if (!can_read_bytes(it, 1 + bytesNeeded))
            return CborErrorUnexpectedEOF;

        if (descriptor <= Value16Bit) {
            if (descriptor == Value16Bit)
                val = read_uint16(it, 1);
            else
                val = read_uint8(it, 1);
        } else {
            if (descriptor == Value32Bit)
                val = read_uint32(it, 1);
            else
                val = read_uint64(it, 1);
        }

        *len = val;
        if (*len != val)
            return CborErrorDataTooLarge;

        ++bytesNeeded;
    }

    *offset = bytesNeeded;
    return CborNoError;
}